

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trimesh_dataset_ensure.h
# Opt level: O0

cellid_t __thiscall trimesh::dataset_t::max_vert<_1>(dataset_t *this,cellid_t c)

{
  int iVar1;
  cellid_t *pcVar2;
  ostream *poVar3;
  runtime_error *this_00;
  string local_1d0 [48];
  stringstream local_1a0 [8];
  stringstream ss;
  ostream local_190 [380];
  cellid_t local_14;
  dataset_t *pdStack_10;
  cellid_t c_local;
  dataset_t *this_local;
  
  local_14 = c;
  pdStack_10 = this;
  iVar1 = cell_dim(this,c);
  if (iVar1 != 0) {
    if (iVar1 != 1) {
      if (iVar1 != 2) {
        std::__cxx11::stringstream::stringstream(local_1a0);
        poVar3 = std::operator<<(local_190,"Failed to assert condition ");
        poVar3 = std::operator<<(poVar3,"false&&\"invalid celldim\"");
        poVar3 = std::operator<<(poVar3,"\n");
        poVar3 = std::operator<<(poVar3,"at (");
        poVar3 = std::operator<<(poVar3,
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/nithins[P]mscomplex-tri/core/trimesh_dataset_ensure.h"
                                );
        poVar3 = std::operator<<(poVar3,",");
        poVar3 = std::operator<<(poVar3,"max_vert");
        poVar3 = std::operator<<(poVar3,",");
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x3e);
        std::operator<<(poVar3,") \n ");
        this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::__cxx11::stringstream::str();
        std::runtime_error::runtime_error(this_00,local_1d0);
        __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      pcVar2 = max_fct(this,local_14);
      local_14 = *pcVar2;
    }
    pcVar2 = max_fct(this,local_14);
    local_14 = *pcVar2;
  }
  return local_14;
}

Assistant:

inline cellid_t dataset_t::max_vert<-1>(cellid_t c) const
  {
    switch(cell_dim(c))
    {
      case 2: c = max_fct(c);//break;
      case 1: c = max_fct(c);//break;
      case 0: return c;
    }
    ASSERT(false&&"invalid celldim");
    return c;
  }